

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

void __thiscall
duckdb::CSVError::CSVError
          (CSVError *this,string *error_message_p,CSVErrorType type_p,idx_t column_idx_p,
          string *csv_row_p,LinesPerBoundary error_info_p,idx_t row_byte_position,
          optional_idx byte_position_p,CSVReaderOptions *reader_options,string *fixes,
          string *current_path)

{
  string *this_00;
  ulong uVar1;
  pointer pcVar2;
  ostream *poVar3;
  string local_1c8;
  ostringstream error;
  
  ::std::__cxx11::string::string((string *)this,(string *)error_message_p);
  (this->full_error_message)._M_dataplus._M_p = (pointer)&(this->full_error_message).field_2;
  (this->full_error_message)._M_string_length = 0;
  (this->full_error_message).field_2._M_local_buf[0] = '\0';
  this->type = type_p;
  this->column_idx = column_idx_p;
  this_00 = &this->csv_row;
  ::std::__cxx11::string::string((string *)this_00,(string *)csv_row_p);
  (this->error_info).boundary_idx = error_info_p.boundary_idx;
  (this->error_info).lines_in_batch = error_info_p.lines_in_batch;
  this->row_byte_position = row_byte_position;
  (this->byte_position).index = byte_position_p.index;
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  if ((reader_options->ignore_errors).value == true) {
    RemoveNewLine(&this->error_message);
  }
  uVar1 = (this->csv_row)._M_string_length;
  if (10000 < uVar1) {
    pcVar2 = (this_00->_M_dataplus)._M_p;
    ::std::__cxx11::string::erase(this_00,pcVar2 + 10000,pcVar2 + uVar1);
  }
  poVar3 = ::std::operator<<((ostream *)&error,(string *)this);
  ::std::operator<<(poVar3,'\n');
  poVar3 = ::std::operator<<((ostream *)&error,(string *)fixes);
  ::std::operator<<(poVar3,'\n');
  CSVReaderOptions::ToString(&local_1c8,reader_options,current_path);
  ::std::operator<<((ostream *)&error,(string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::operator<<((ostream *)&error,'\n');
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::operator=((string *)&this->full_error_message,(string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return;
}

Assistant:

CSVError::CSVError(string error_message_p, CSVErrorType type_p, idx_t column_idx_p, string csv_row_p,
                   LinesPerBoundary error_info_p, idx_t row_byte_position, optional_idx byte_position_p,
                   const CSVReaderOptions &reader_options, const string &fixes, const string &current_path)
    : error_message(std::move(error_message_p)), type(type_p), column_idx(column_idx_p), csv_row(std::move(csv_row_p)),
      error_info(error_info_p), row_byte_position(row_byte_position), byte_position(byte_position_p) {
	// What were the options
	std::ostringstream error;
	if (reader_options.ignore_errors.GetValue()) {
		RemoveNewLine(error_message);
	}
	// Let's cap the csv row to 10k bytes. For performance reasons.
	if (csv_row.size() > 10000) {
		csv_row.erase(csv_row.begin() + 10000, csv_row.end());
	}
	error << error_message << '\n';
	error << fixes << '\n';
	error << reader_options.ToString(current_path);
	error << '\n';
	full_error_message = error.str();
}